

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlTextConcat(xmlNodePtr node,xmlChar *content,int len)

{
  int len_local;
  xmlChar *content_local;
  xmlNodePtr node_local;
  
  if (node == (xmlNodePtr)0x0) {
    node_local._4_4_ = -1;
  }
  else if ((((node->type == XML_TEXT_NODE) || (node->type == XML_CDATA_SECTION_NODE)) ||
           (node->type == XML_COMMENT_NODE)) || (node->type == XML_PI_NODE)) {
    node_local._4_4_ = xmlTextAddContent(node,content,len);
  }
  else {
    node_local._4_4_ = -1;
  }
  return node_local._4_4_;
}

Assistant:

int
xmlTextConcat(xmlNodePtr node, const xmlChar *content, int len) {
    if (node == NULL)
        return(-1);

    if ((node->type != XML_TEXT_NODE) &&
        (node->type != XML_CDATA_SECTION_NODE) &&
	(node->type != XML_COMMENT_NODE) &&
	(node->type != XML_PI_NODE))
        return(-1);

    return(xmlTextAddContent(node, content, len));
}